

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O3

AlignedSentencePair * __thiscall
jhu::thrax::readAlignedSentencePair<false,false>
          (AlignedSentencePair *__return_storage_ptr__,thrax *this,string_view line)

{
  char *pcVar1;
  string_view line_00;
  string_view line_01;
  string_view sv;
  Sentence sentence_1;
  Sentence sentence;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> fs;
  Alignment local_88;
  Sentence local_70;
  Sentence local_58;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> local_40;
  
  pcVar1 = line._M_str;
  fields(&local_40,this,line);
  line_00._M_str = pcVar1;
  line_00._M_len = (size_t)local_40._M_elems[0]._M_str;
  split(&local_58,(thrax *)local_40._M_elems[0]._M_len,line_00);
  line_01._M_str = pcVar1;
  line_01._M_len = (size_t)local_40._M_elems[1]._M_str;
  split(&local_70,(thrax *)local_40._M_elems[1]._M_len,line_01);
  sv._M_str = pcVar1;
  sv._M_len = (size_t)local_40._M_elems[2]._M_str;
  readAlignment(&local_88,(thrax *)local_40._M_elems[2]._M_len,sv);
  AlignedSentencePair::AlignedSentencePair(__return_storage_ptr__,&local_58,&local_70,&local_88);
  if (local_88.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

AlignedSentencePair readAlignedSentencePair(std::string_view line) {
  auto fs = fields(line);
  static_assert(std::tuple_size<decltype(fs)>::value == 3);
  return {
    tokens<SourceIsParsed>(fs[0]),
    tokens<TargetIsParsed>(fs[1]),
    readAlignment(fs[2])
  };
}